

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddTuples(DdManager *dd,int K,DdNode *VarsN)

{
  int iVar1;
  DdNode *pDVar2;
  int local_50;
  int local_4c;
  int i;
  int nVars;
  DdNode *VarsK;
  DdNode *VarSet;
  int autoDyn;
  DdNode *res;
  DdNode *VarsN_local;
  int K_local;
  DdManager *dd_local;
  
  iVar1 = dd->autoDyn;
  dd->autoDyn = 0;
  while( true ) {
    local_4c = 0;
    for (VarsK = VarsN; VarsK != dd->one; VarsK = (VarsK->type).kids.T) {
      local_4c = local_4c + 1;
      if ((VarsK->type).kids.E != (DdNode *)((ulong)dd->one ^ 1)) {
        return (DdNode *)0x0;
      }
    }
    if (local_4c < K) break;
    _i = VarsN;
    for (local_50 = 0; local_50 < local_4c - K; local_50 = local_50 + 1) {
      _i = (_i->type).kids.T;
    }
    dd->reordered = 0;
    pDVar2 = extraBddTuples(dd,_i,VarsN);
    if (dd->reordered != 1) {
      dd->autoDyn = iVar1;
      return pDVar2;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Extra_bddTuples( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * VarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *res;
    int     autoDyn;

    /* it is important that reordering does not happen, 
       otherwise, this methods will not work */

    autoDyn = dd->autoDyn;
    dd->autoDyn = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode * argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *VarSet = VarsN, *VarsK = VarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( VarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( VarSet ) != b0 )
                return NULL;
            VarSet = cuddT( VarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stands for <n>;
         * create the first argument, which stands for <k> 
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            VarsK = cuddT( VarsK );

        dd->reordered = 0;
        res = extraBddTuples(dd, VarsK, VarsN );

    } while (dd->reordered == 1);
    dd->autoDyn = autoDyn;
    return(res);

}